

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

Au_Man_t * Au_ManAlloc(char *pName)

{
  uint uVar1;
  uint uVar2;
  Au_Man_t *pAVar3;
  size_t sVar4;
  char *__dest;
  void **ppvVar5;
  int iVar6;
  
  pAVar3 = (Au_Man_t *)calloc(1,0x40);
  if (pName == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(pName);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,pName);
  }
  pAVar3->pName = __dest;
  if ((pAVar3->vNtks).nCap < 0x6f) {
    ppvVar5 = (pAVar3->vNtks).pArray;
    if (ppvVar5 == (void **)0x0) {
      ppvVar5 = (void **)malloc(0x378);
    }
    else {
      ppvVar5 = (void **)realloc(ppvVar5,0x378);
    }
    (pAVar3->vNtks).pArray = ppvVar5;
    (pAVar3->vNtks).nCap = 0x6f;
  }
  uVar1 = (pAVar3->vNtks).nSize;
  uVar2 = (pAVar3->vNtks).nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar5 = (pAVar3->vNtks).pArray;
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,0x80);
      }
      (pAVar3->vNtks).pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_0084f296;
      ppvVar5 = (pAVar3->vNtks).pArray;
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar2 << 4);
      }
      (pAVar3->vNtks).pArray = ppvVar5;
    }
    (pAVar3->vNtks).nCap = iVar6;
  }
LAB_0084f296:
  (pAVar3->vNtks).nSize = uVar1 + 1;
  (pAVar3->vNtks).pArray[(int)uVar1] = (void *)0x0;
  return pAVar3;
}

Assistant:

Au_Man_t * Au_ManAlloc( char * pName )
{
    Au_Man_t * p;
    p = ABC_CALLOC( Au_Man_t, 1 );
    p->pName = Au_UtilStrsav( pName );
    Vec_PtrGrow( &p->vNtks,  111 );
    Vec_PtrPush( &p->vNtks, NULL );
    return p;
}